

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamRandomAccessController_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::BamRandomAccessController::CreateIndex
          (BamRandomAccessController *this,BamReaderPrivate *reader,IndexType *type)

{
  bool bVar1;
  int iVar2;
  BamIndex *index;
  ostream *this_00;
  string message;
  stringstream s;
  allocator local_1e1;
  string local_1e0;
  string local_1c0;
  undefined1 local_1a0 [392];
  
  bVar1 = BamReaderPrivate::IsOpen(reader);
  if (bVar1) {
    index = BamIndexFactory::CreateIndexOfType(type,reader);
    if (index == (BamIndex *)0x0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
      this_00 = std::operator<<((ostream *)(local_1a0 + 0x10),"could not create index of type: ");
      std::ostream::operator<<(this_00,*type);
      std::__cxx11::string::string
                ((string *)&local_1e0,"BamRandomAccessController::CreateIndex",&local_1e1);
      std::__cxx11::stringbuf::str();
      SetErrorString(this,&local_1e0,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      return false;
    }
    iVar2 = (*index->_vptr_BamIndex[2])(index);
    if ((char)iVar2 != '\0') {
      SetIndex(this,index);
      return true;
    }
    std::__cxx11::string::string((string *)local_1a0,(string *)&index->m_errorString);
    std::operator+(&local_1e0,"could not create index: \n\t",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0);
    std::__cxx11::string::string
              ((string *)&local_1c0,"BamRandomAccessController::CreateIndex",&local_1e1);
    SetErrorString(this,&local_1c0,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1c0);
  }
  else {
    std::__cxx11::string::string
              ((string *)local_1a0,"BamRandomAccessController::CreateIndex",(allocator *)&local_1c0)
    ;
    std::__cxx11::string::string
              ((string *)&local_1e0,"cannot create index for unopened reader",&local_1e1);
    SetErrorString(this,(string *)local_1a0,&local_1e0);
  }
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)local_1a0);
  return false;
}

Assistant:

bool BamRandomAccessController::CreateIndex(BamReaderPrivate* reader,
                                            const BamIndex::IndexType& type)
{
    // skip if reader is invalid
    assert(reader);
    if (!reader->IsOpen()) {
        SetErrorString("BamRandomAccessController::CreateIndex",
                       "cannot create index for unopened reader");
        return false;
    }

    // create new index of requested type
    BamIndex* newIndex = BamIndexFactory::CreateIndexOfType(type, reader);
    if (newIndex == 0) {
        std::stringstream s;
        s << "could not create index of type: " << type;
        SetErrorString("BamRandomAccessController::CreateIndex", s.str());
        return false;
    }

    // attempt to build index from current BamReader file
    if (!newIndex->Create()) {
        const std::string indexError = newIndex->GetErrorString();
        const std::string message = "could not create index: \n\t" + indexError;
        SetErrorString("BamRandomAccessController::CreateIndex", message);
        return false;
    }

    // save new index & return success
    SetIndex(newIndex);
    return true;
}